

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_node.c
# Opt level: O0

LY_ERR lysc_unres_when_add(lysc_ctx *ctx,lysc_when *when,lysc_node *node)

{
  LY_ERR LVar1;
  undefined8 *local_30;
  lysc_unres_when *w;
  LY_ERR rc;
  lysc_node *node_local;
  lysc_when *when_local;
  lysc_ctx *ctx_local;
  
  w._4_4_ = LY_SUCCESS;
  local_30 = (undefined8 *)0x0;
  if ((ctx->compile_opts & 3) == 0) {
    local_30 = (undefined8 *)calloc(1,0x10);
    if (local_30 == (undefined8 *)0x0) {
      ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysc_unres_when_add");
      w._4_4_ = LY_EMEM;
    }
    else {
      *local_30 = node;
      local_30[1] = when;
      LVar1 = ly_set_add(&ctx->unres->whens,local_30,'\x01',(uint32_t *)0x0);
      if (LVar1 == LY_SUCCESS) {
        local_30 = (undefined8 *)0x0;
      }
      else {
        ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysc_unres_when_add");
        w._4_4_ = LY_EMEM;
      }
    }
  }
  free(local_30);
  return w._4_4_;
}

Assistant:

static LY_ERR
lysc_unres_when_add(struct lysc_ctx *ctx, struct lysc_when *when, struct lysc_node *node)
{
    LY_ERR rc = LY_SUCCESS;
    struct lysc_unres_when *w = NULL;

    /* do not check when(s) in a grouping or in disabled data (high risk of false-positives) */
    if (ctx->compile_opts & (LYS_COMPILE_GROUPING | LYS_COMPILE_DISABLED)) {
        goto cleanup;
    }

    /* add new unres when */
    w = calloc(1, sizeof *w);
    LY_CHECK_ERR_GOTO(!w, LOGMEM(ctx->ctx); rc = LY_EMEM, cleanup);

    w->node = node;
    w->when = when;

    /* add into the unres set */
    LY_CHECK_ERR_GOTO(ly_set_add(&ctx->unres->whens, w, 1, NULL), LOGMEM(ctx->ctx); rc = LY_EMEM, cleanup);
    w = NULL;

cleanup:
    free(w);
    return rc;
}